

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O1

void matras_alloc_overflow_test(void)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  matras mStack_200;
  matras_view mStack_1a8;
  matras_view mStack_188;
  uint uStack_164;
  matras *pmStack_160;
  matras mStack_128;
  uint uStack_cc;
  matras *pmStack_c8;
  undefined1 local_90 [8];
  matras mat;
  matras_id_t id;
  
  _space(_stdout);
  uVar6 = 0;
  printf("# *** %s ***\n","matras_alloc_overflow_test");
  plan(2);
  matras_create((matras *)local_90,0x10,&pta_allocator,(matras_stats *)0x0);
  while( true ) {
    pvVar4 = matras_alloc((matras *)local_90,(matras_id_t *)((long)&mat.stats + 4));
    if (pvVar4 == (void *)0x0) break;
    if (uVar6 != mat.stats._4_4_) goto LAB_00103e68;
    uVar6 = uVar6 + 1;
    if (uVar6 == 0x100) {
      pvVar4 = matras_alloc((matras *)local_90,(matras_id_t *)((long)&mat.stats + 4));
      _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x156
          ,"line %d",0x156);
      _ok((uint)(mat.stats._4_4_ == 0xff),"id == max_capacity - 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x157
          ,"line %d",0x157);
      matras_destroy((matras *)local_90);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_overflow_test");
      check_plan();
      return;
    }
  }
  matras_alloc_overflow_test();
LAB_00103e68:
  matras_alloc_overflow_test();
  pmStack_c8 = (matras *)local_90;
  _space(_stdout);
  printf("# *** %s ***\n","matras_alloc_range_overflow_test");
  plan(2);
  matras_create(&mStack_128,0x10,&pta_allocator,(matras_stats *)0x0);
  uVar6 = 0xfffffffffffffffc;
  while (pvVar4 = matras_alloc_range(&mStack_128,&uStack_cc,4), pvVar4 != (void *)0x0) {
    uVar6 = uVar6 + 4;
    if (uVar6 != uStack_cc) goto LAB_00103fc3;
    if (0xfb < uVar6) {
      pvVar4 = matras_alloc_range(&mStack_128,&uStack_cc,4);
      _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc_range(&mat, &id, range_count) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x172
          ,"line %d",0x172);
      _ok((uint)(uStack_cc == 0xfc),"id == max_capacity - range_count",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x173
          ,"line %d",0x173);
      matras_destroy(&mStack_128);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_range_overflow_test");
      check_plan();
      return;
    }
  }
  matras_alloc_range_overflow_test();
LAB_00103fc3:
  matras_alloc_range_overflow_test();
  pmStack_160 = &mStack_128;
  _space(_stdout);
  uVar6 = 0;
  printf("# *** %s ***\n","matras_touch_reserve_test");
  plan(0xe);
  matras_create(&mStack_200,0x10,&pta_allocator,(matras_stats *)0x0);
  matras_create_read_view(&mStack_200,&mStack_1a8);
  do {
    pvVar4 = matras_alloc(&mStack_200,&uStack_164);
    if (pvVar4 == (void *)0x0) {
      matras_touch_reserve_test();
LAB_00104551:
      matras_touch_reserve_test();
      goto LAB_00104556;
    }
    if (uVar6 != uStack_164) goto LAB_00104551;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x100);
  pvVar4 = matras_alloc(&mStack_200,&uStack_164);
  iVar5 = 0;
  _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x195,
      "line %d",0x195);
  _ok((uint)(uStack_164 == 0xff),"id == max_capacity - 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x196,
      "line %d",0x196);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_200,0);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19b,
      "line %d",0x19b);
  matras_touch_reserve(&mStack_200,1);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19d,
      "line %d",0x19d);
  matras_touch_reserve(&mStack_200,0x80);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19f,
      "line %d",0x19f);
  matras_touch_reserve(&mStack_200,0x100);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a1,
      "line %d",0x1a1);
  matras_destroy_read_view(&mStack_200,&mStack_1a8);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_200,0);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a7,
      "line %d",0x1a7);
  matras_touch_reserve(&mStack_200,1);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a9,
      "line %d",0x1a9);
  matras_touch_reserve(&mStack_200,0x80);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ab,
      "line %d",0x1ab);
  matras_touch_reserve(&mStack_200,0x100);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ad,
      "line %d",0x1ad);
  matras_create_read_view(&mStack_200,&mStack_188);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_200,2);
  _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1b6,
      "line %d",0x1b6);
  matras_touch(&mStack_200,0);
  matras_touch(&mStack_200,uStack_164);
  _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ba,
      "line %d",0x1ba);
  matras_destroy_read_view(&mStack_200,&mStack_188);
  matras_create_read_view(&mStack_200,&mStack_188);
  matras_touch(&mStack_200,uStack_164 >> 1);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_200,2);
  _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1c7,
      "line %d",0x1c7);
  matras_touch(&mStack_200,0);
  matras_touch(&mStack_200,uStack_164);
  _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1cb,
      "line %d",0x1cb);
  do {
    uVar2 = rand();
    matras_touch_reserve(&mStack_200,uVar2 & 0xff);
    sVar1 = AllocatedCount;
    for (uVar2 = uVar2 & 0xff; uVar2 != 0; uVar2 = uVar2 - 1) {
      uVar3 = rand();
      matras_touch(&mStack_200,uVar3 & 0xff);
    }
    if (AllocatedCount != sVar1) goto LAB_00104556;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 10000);
  iVar5 = 0;
  while( true ) {
    matras_destroy_read_view(&mStack_200,&mStack_188);
    matras_create_read_view(&mStack_200,&mStack_188);
    uVar2 = rand();
    matras_touch_reserve(&mStack_200,uVar2 & 0xff);
    sVar1 = AllocatedCount;
    for (uVar2 = uVar2 & 0xff; uVar2 != 0; uVar2 = uVar2 - 1) {
      uVar3 = rand();
      matras_touch(&mStack_200,uVar3 & 0xff);
    }
    if (AllocatedCount != sVar1) break;
    iVar5 = iVar5 + 1;
    if (iVar5 == 10000) {
      matras_destroy_read_view(&mStack_200,&mStack_188);
      matras_destroy(&mStack_200);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_touch_reserve_test");
      check_plan();
      return;
    }
  }
LAB_0010455b:
  matras_touch_reserve_test();
  plan(7);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  matras_allocator_create(&pta_allocator,0x40,pta_alloc,pta_free);
  matras_allocator_create(&ver_allocator,0x200,all,dea);
  matras_alloc_test();
  matras_vers_test();
  matras_gh_1145_test();
  matras_stats_test();
  matras_alloc_overflow_test();
  matras_alloc_range_overflow_test();
  matras_touch_reserve_test();
  matras_allocator_destroy(&pta_allocator);
  matras_allocator_destroy(&ver_allocator);
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  check_plan();
  return;
LAB_00104556:
  matras_touch_reserve_test();
  goto LAB_0010455b;
}

Assistant:

void
matras_alloc_overflow_test()
{
	header();
	plan(2);

	size_t max_capacity = PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);

	matras_id_t id;
	struct matras mat;
	matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
	for (size_t i = 0; i < max_capacity; i++) {
		void *data = matras_alloc(&mat, &id);
		fail_unless(data != NULL);
		fail_unless(id == i);
	}
	/* Try to exceed the maximum capacity. */
	ok(matras_alloc(&mat, &id) == NULL);
	ok(id == max_capacity - 1);
	matras_destroy(&mat);

	footer();
	check_plan();
}